

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void cmAddLinkLibraryForTarget(void *arg,char *tgt,char *value,int libtype)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  if (libtype == 2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,tgt,&local_51);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,value,&local_52);
    addLinkLibrary((cmMakefile *)arg,&local_30,&local_50,OPTIMIZED_LibraryType);
  }
  else if (libtype == 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,tgt,&local_51);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,value,&local_52);
    addLinkLibrary((cmMakefile *)arg,&local_30,&local_50,DEBUG_LibraryType);
  }
  else {
    if (libtype != 0) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,tgt,&local_51);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,value,&local_52);
    addLinkLibrary((cmMakefile *)arg,&local_30,&local_50,GENERAL_LibraryType);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void CCONV cmAddLinkLibraryForTarget(void* arg, const char* tgt,
                                            const char* value, int libtype)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);

  switch (libtype) {
    case CM_LIBRARY_GENERAL:
      addLinkLibrary(mf, tgt, value, GENERAL_LibraryType);
      break;
    case CM_LIBRARY_DEBUG:
      addLinkLibrary(mf, tgt, value, DEBUG_LibraryType);
      break;
    case CM_LIBRARY_OPTIMIZED:
      addLinkLibrary(mf, tgt, value, OPTIMIZED_LibraryType);
      break;
  }
}